

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  archive *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  ostream *poVar7;
  archive_entry *paVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  size_t size_00;
  char *local_128;
  size_t size;
  uint local_e4;
  time_t tStack_e0;
  mode_t perm;
  time_t t;
  time_t now;
  string local_c8;
  allocator local_a1;
  string local_a0;
  Entry local_80;
  Entry e;
  allocator local_61;
  undefined1 local_60 [8];
  string dest;
  cmLocaleRAII localeRAII;
  char *out;
  char *prefix_local;
  size_t skip_local;
  char *file_local;
  cmArchiveWrite *this_local;
  
  sVar6 = strlen(file);
  if (sVar6 <= skip) {
    return true;
  }
  cmLocaleRAII::cmLocaleRAII((cmLocaleRAII *)((long)&dest.field_2 + 8));
  local_128 = prefix;
  if (prefix == (char *)0x0) {
    local_128 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,local_128,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::operator+=((string *)local_60,file + skip);
  if ((this->Verbose & 1U) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_60);
    std::operator<<(poVar7,"\n");
  }
  Entry::Entry(&local_80);
  paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,file,&local_a1);
  cm_archive_entry_copy_sourcepath(paVar8,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
  cm_archive_entry_copy_pathname(paVar8,(string *)local_60);
  paVar1 = this->Disk;
  paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
  iVar3 = archive_read_disk_entry_from_file(paVar1,paVar8,-1,(stat *)0x0);
  if (iVar3 == 0) {
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      time(&t);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      tStack_e0 = cm_get_date(t,pcVar10);
      if (tStack_e0 == -1) {
        std::__cxx11::string::operator=((string *)&this->Error,"unable to parse mtime \'");
        std::__cxx11::string::operator+=((string *)&this->Error,(string *)&this->MTime);
        std::__cxx11::string::operator+=((string *)&this->Error,"\'");
        this_local._7_1_ = false;
        goto LAB_0055a4d2;
      }
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      archive_entry_set_mtime(paVar8,tStack_e0,0);
    }
    bVar2 = cmArchiveWriteOptional<int>::IsSet(&this->Uid);
    if ((bVar2) && (bVar2 = cmArchiveWriteOptional<int>::IsSet(&this->Gid), bVar2)) {
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      iVar3 = cmArchiveWriteOptional<int>::Get(&this->Uid);
      archive_entry_set_uid(paVar8,(long)iVar3);
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      iVar3 = cmArchiveWriteOptional<int>::Get(&this->Gid);
      archive_entry_set_gid(paVar8,(long)iVar3);
    }
    lVar11 = std::__cxx11::string::size();
    if ((lVar11 != 0) && (lVar11 = std::__cxx11::string::size(), lVar11 != 0)) {
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      archive_entry_set_uname(paVar8,pcVar10);
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      archive_entry_set_gname(paVar8,pcVar10);
    }
    bVar2 = cmArchiveWriteOptional<unsigned_int>::IsSet(&this->Permissions);
    if (bVar2) {
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      uVar4 = cmArchiveWriteOptional<unsigned_int>::Get(&this->Permissions);
      archive_entry_set_perm(paVar8,uVar4);
    }
    bVar2 = cmArchiveWriteOptional<unsigned_int>::IsSet(&this->PermissionsMask);
    if (bVar2) {
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      local_e4 = archive_entry_perm(paVar8);
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      uVar4 = local_e4;
      uVar5 = cmArchiveWriteOptional<unsigned_int>::Get(&this->PermissionsMask);
      archive_entry_set_perm(paVar8,uVar4 & uVar5);
    }
    paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
    archive_entry_acl_clear(paVar8);
    paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
    archive_entry_xattr_clear(paVar8);
    paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
    archive_entry_set_fflags(paVar8,0,0);
    bVar2 = std::operator==(&this->Format,"pax");
    if ((bVar2) || (bVar2 = std::operator==(&this->Format,"paxr"), bVar2)) {
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      archive_entry_sparse_clear(paVar8);
    }
    paVar1 = this->Archive;
    paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
    iVar3 = archive_write_header(paVar1,paVar8);
    if (iVar3 == 0) {
      paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
      pcVar10 = archive_entry_symlink(paVar8);
      if (pcVar10 == (char *)0x0) {
        paVar8 = Entry::operator_cast_to_archive_entry_(&local_80);
        size_00 = archive_entry_size(paVar8);
        if (size_00 != 0) {
          this_local._7_1_ = AddData(this,file,size_00);
          goto LAB_0055a4d2;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Error,"archive_write_header: ");
      cm_archive_error_string_abi_cxx11_((string *)&size,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&size);
      std::__cxx11::string::~string((string *)&size);
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Error,"archive_read_disk_entry_from_file \'");
    std::__cxx11::string::operator+=((string *)&this->Error,file);
    std::__cxx11::string::operator+=((string *)&this->Error,"\': ");
    cm_archive_error_string_abi_cxx11_(&local_c8,this->Disk);
    std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    this_local._7_1_ = false;
  }
LAB_0055a4d2:
  now._4_4_ = 1;
  Entry::~Entry(&local_80);
  std::__cxx11::string::~string((string *)local_60);
  cmLocaleRAII::~cmLocaleRAII((cmLocaleRAII *)((long)&dest.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file,
                             size_t skip, const char* prefix)
{
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if(skip >= strlen(file))
    {
    return true;
    }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = prefix? prefix : "";
  dest += out;
  if(this->Verbose)
    {
    std::cout << dest << "\n";
    }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if(archive_read_disk_entry_from_file(this->Disk, e, -1, 0) != ARCHIVE_OK)
    {
    this->Error = "archive_read_disk_entry_from_file '";
    this->Error += file;
    this->Error += "': ";
    this->Error += cm_archive_error_string(this->Disk);
    return false;
    }
  if (!this->MTime.empty())
    {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1)
      {
      this->Error = "unable to parse mtime '";
      this->Error += this->MTime;
      this->Error += "'";
      return false;
      }
    archive_entry_set_mtime(e, t, 0);
    }

  // manages the uid/guid of the entry (if any)
  if (this->Uid.IsSet() && this->Gid.IsSet())
    {
    archive_entry_set_uid(e, this->Uid.Get());
    archive_entry_set_gid(e, this->Gid.Get());
    }

  if (this->Uname.size() && this->Gname.size())
    {
    archive_entry_set_uname(e, this->Uname.c_str());
    archive_entry_set_gname(e, this->Gname.c_str());
    }


  // manages the permissions
  if (this->Permissions.IsSet())
    {
    archive_entry_set_perm(e, this->Permissions.Get());
    }

  if (this->PermissionsMask.IsSet())
    {
    mode_t perm = archive_entry_perm(e);
    archive_entry_set_perm(e, perm & this->PermissionsMask.Get());
    }

  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);

  if (this->Format == "pax" || this->Format == "paxr")
    {
    // Sparse files are a GNU tar extension.
    // Do not use them in standard tar files.
    archive_entry_sparse_clear(e);
    }

  if(archive_write_header(this->Archive, e) != ARCHIVE_OK)
    {
    this->Error = "archive_write_header: ";
    this->Error += cm_archive_error_string(this->Archive);
    return false;
    }

  // do not copy content of symlink
  if (!archive_entry_symlink(e))
    {
    // Content.
    if(size_t size = static_cast<size_t>(archive_entry_size(e)))
      {
      return this->AddData(file, size);
      }
    }
  return true;
}